

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::Logger::Logger(Logger *this,string *id,LogStreamsReferenceMap *logStreamsReference)

{
  pointer pcVar1;
  
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00193660;
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__Logger_001936a0;
  (this->m_id)._M_dataplus._M_p = (pointer)&(this->m_id).field_2;
  pcVar1 = (id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_id,pcVar1,pcVar1 + id->_M_string_length);
  this->m_typedConfigurations = (TypedConfigurations *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_stream);
  (this->m_parentApplicationName)._M_dataplus._M_p =
       (pointer)&(this->m_parentApplicationName).field_2;
  (this->m_parentApplicationName)._M_string_length = 0;
  (this->m_parentApplicationName).field_2._M_local_buf[0] = '\0';
  this->m_isConfigured = false;
  *(undefined8 *)
   &(this->m_configurations).super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
    .
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .m_list = 0;
  *(undefined8 *)
   &(this->m_configurations).super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
    .
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .field_0x18 = 0;
  *(undefined8 *)
   &(this->m_configurations).super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
    .
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .field_0x20 = 0;
  (this->m_configurations).super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
  super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00192ab0;
  (this->m_configurations).m_configurationFile._M_dataplus._M_p =
       (pointer)&(this->m_configurations).m_configurationFile.field_2;
  (this->m_configurations).m_configurationFile._M_string_length = 0;
  (this->m_configurations).m_configurationFile.field_2._M_local_buf[0] = '\0';
  (this->m_configurations).m_isFromFile = false;
  (this->m_unflushedCount)._M_h._M_buckets = &(this->m_unflushedCount)._M_h._M_single_bucket;
  (this->m_unflushedCount)._M_h._M_bucket_count = 1;
  (this->m_unflushedCount)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_unflushedCount)._M_h._M_element_count = 0;
  (this->m_unflushedCount)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_unflushedCount)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_unflushedCount)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_logStreamsReference = logStreamsReference;
  (this->m_logBuilder).super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_logBuilder).super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  initUnflushedCount(this);
  return;
}

Assistant:

Logger::Logger(const std::string& id, base::LogStreamsReferenceMap* logStreamsReference) :
  m_id(id),
  m_typedConfigurations(nullptr),
  m_parentApplicationName(std::string()),
  m_isConfigured(false),
  m_logStreamsReference(logStreamsReference) {
  initUnflushedCount();
}